

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBase32.cxx
# Opt level: O3

string * __thiscall
cmBase32Encoder::encodeString_abi_cxx11_
          (string *__return_storage_ptr__,cmBase32Encoder *this,uchar *input,size_t len,bool padding
          )

{
  byte bVar1;
  long lVar2;
  undefined3 in_register_00000081;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar *__s;
  uchar extended [5];
  char buffer [8];
  uchar local_51 [5];
  undefined4 local_4c;
  char local_48 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_t local_38;
  
  local_4c = CONCAT31(in_register_00000081,padding);
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = local_51 + len;
  local_38 = len;
  for (lVar2 = 0; input + lVar2 + 5 <= input + len; lVar2 = lVar2 + 5) {
    Base32Encode5(input + lVar2,local_48);
    __s = __s + -5;
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_48);
  }
  lVar3 = lVar2 - local_38;
  lVar4 = lVar2 - local_38;
  if (lVar4 == 0) {
    return __return_storage_ptr__;
  }
  lVar5 = local_38 - 5;
  memcpy(local_51,input + lVar2,-lVar3);
  if (lVar5 == lVar2) {
    Base32Encode5(local_51,local_48);
switchD_0044e75a_default:
    bVar1 = 0;
    lVar2 = 0;
  }
  else {
    memset(__s,0,lVar4 + 5);
    Base32Encode5(local_51,local_48);
    switch(-lVar3) {
    case 1:
      lVar2 = 6;
      break;
    case 2:
      lVar2 = 4;
      break;
    case 3:
      lVar2 = 3;
      break;
    case 4:
      lVar2 = 1;
      break;
    default:
      goto switchD_0044e75a_default;
    }
    bVar1 = 1;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_48);
  if ((bVar1 & (byte)local_4c) == 1) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmBase32Encoder::encodeString(const unsigned char* input,
                                          size_t len, bool padding)
{
  std::string res;

  static const size_t blockSize = 5;
  static const size_t bufferSize = 8;
  char buffer[bufferSize];

  const unsigned char* end = input + len;
  while ((input + blockSize) <= end) {
    Base32Encode5(input, buffer);
    res.append(buffer, bufferSize);
    input += blockSize;
  }

  size_t remain = static_cast<size_t>(end - input);
  if (remain != 0) {
    // Temporary source buffer filled up with 0s
    unsigned char extended[blockSize];
    for (size_t ii = 0; ii != remain; ++ii) {
      extended[ii] = input[ii];
    }
    for (size_t ii = remain; ii != blockSize; ++ii) {
      extended[ii] = 0;
    }

    Base32Encode5(extended, buffer);
    size_t numPad(0);
    switch (remain) {
      case 1:
        numPad = 6;
        break;
      case 2:
        numPad = 4;
        break;
      case 3:
        numPad = 3;
        break;
      case 4:
        numPad = 1;
        break;
      default:
        break;
    }
    res.append(buffer, bufferSize - numPad);
    if (padding) {
      for (size_t ii = 0; ii != numPad; ++ii) {
        res.push_back(paddingChar);
      }
    }
  }

  return res;
}